

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

bool __thiscall
std::less<ftxui::(anonymous_namespace)::TileEncoding>::operator()
          (less<ftxui::(anonymous_namespace)::TileEncoding> *this,TileEncoding *__x,
          TileEncoding *__y)

{
  ushort uVar1;
  TileEncoding TVar2;
  bool bVar3;
  ushort uVar4;
  ushort uVar5;
  
  uVar1 = *(ushort *)this;
  TVar2 = *__x;
  bVar3 = true;
  if (((ushort)TVar2 & 3) <= (uVar1 & 3)) {
    if ((uVar1 & 3) <= ((ushort)TVar2 & 3)) {
      uVar4 = uVar1 >> 2 & 3;
      uVar5 = (ushort)TVar2 >> 2 & 3;
      if (uVar4 < uVar5) {
        return true;
      }
      if (uVar4 <= uVar5) {
        uVar4 = uVar1 >> 4 & 3;
        uVar5 = (ushort)TVar2 >> 4 & 3;
        if (uVar4 < uVar5) {
          return true;
        }
        if (uVar4 <= uVar5) {
          uVar4 = uVar1 >> 6 & 3;
          uVar5 = (ushort)TVar2 >> 6 & 3;
          if (uVar4 < uVar5) {
            return true;
          }
          if (uVar4 <= uVar5) {
            return (uVar1 >> 8 & 1) < (ushort)(((ushort)TVar2 >> 8 & 1) != 0);
          }
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const TileEncoding& other) const {
    if (left < other.left)   { return  true;  }
    if (left > other.left)   { return  false; }
    if (top < other.top)     { return  true;  }
    if (top > other.top)     { return  false; }
    if (right < other.right) { return  true;  }
    if (right > other.right) { return  false; }
    if (down < other.down)   { return  true;  }
    if (down > other.down)   { return  false; }
    if (round < other.round) { return  true;  }
    if (round > other.round) { return  false; }
      return false;
  }